

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O1

ma_result ma_spatializer_listener_init_preallocated
                    (ma_spatializer_listener_config *pConfig,void *pHeap,
                    ma_spatializer_listener *pListener)

{
  uint channels;
  ma_channel *pmVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  ma_uint32 mVar10;
  undefined4 uVar11;
  ulong uVar12;
  ma_result mVar13;
  
  if (pListener == (ma_spatializer_listener *)0x0) {
    mVar13 = MA_INVALID_ARGS;
  }
  else {
    *(undefined8 *)&(pListener->velocity).z = 0;
    *(undefined8 *)&pListener->_ownsHeap = 0;
    (pListener->direction).y = 0.0;
    (pListener->direction).z = 0.0;
    (pListener->velocity).x = 0.0;
    (pListener->velocity).y = 0.0;
    (pListener->position).x = 0.0;
    (pListener->position).y = 0.0;
    *(undefined8 *)&(pListener->position).z = 0;
    (pListener->config).speedOfSound = 0.0;
    (pListener->config).worldUp.x = 0.0;
    (pListener->config).worldUp.y = 0.0;
    (pListener->config).worldUp.z = 0.0;
    (pListener->config).handedness = ma_handedness_right;
    (pListener->config).coneInnerAngleInRadians = 0.0;
    (pListener->config).coneOuterAngleInRadians = 0.0;
    (pListener->config).coneOuterGain = 0.0;
    *(undefined8 *)&pListener->config = 0;
    (pListener->config).pChannelMapOut = (ma_channel *)0x0;
    pListener->_pHeap = (void *)0x0;
    mVar13 = MA_INVALID_ARGS;
    if ((pConfig == (ma_spatializer_listener_config *)0x0) || ((ulong)pConfig->channelsOut == 0)) {
      uVar12 = 0;
      bVar2 = false;
    }
    else {
      uVar12 = (ulong)pConfig->channelsOut + 7 & 0xfffffffffffffff8;
      bVar2 = true;
      mVar13 = MA_SUCCESS;
    }
    if (bVar2) {
      pListener->_pHeap = pHeap;
      if (uVar12 != 0) {
        memset(pHeap,0,uVar12);
      }
      mVar10 = pConfig->channelsOut;
      uVar11 = *(undefined4 *)&pConfig->field_0x4;
      pmVar1 = pConfig->pChannelMapOut;
      fVar3 = pConfig->coneInnerAngleInRadians;
      fVar4 = pConfig->coneOuterAngleInRadians;
      fVar5 = pConfig->coneOuterGain;
      fVar6 = pConfig->speedOfSound;
      fVar7 = (pConfig->worldUp).x;
      fVar8 = (pConfig->worldUp).y;
      fVar9 = (pConfig->worldUp).z;
      (pListener->config).handedness = pConfig->handedness;
      (pListener->config).coneInnerAngleInRadians = fVar3;
      (pListener->config).coneOuterAngleInRadians = fVar4;
      (pListener->config).coneOuterGain = fVar5;
      (pListener->config).speedOfSound = fVar6;
      (pListener->config).worldUp.x = fVar7;
      (pListener->config).worldUp.y = fVar8;
      (pListener->config).worldUp.z = fVar9;
      (pListener->config).channelsOut = mVar10;
      *(undefined4 *)&(pListener->config).field_0x4 = uVar11;
      (pListener->config).pChannelMapOut = pmVar1;
      (pListener->position).x = 0.0;
      (pListener->position).y = 0.0;
      *(undefined8 *)&(pListener->position).z = 0;
      (pListener->direction).y = 0.0;
      (pListener->direction).z = -1.0;
      (pListener->velocity).x = 0.0;
      (pListener->velocity).y = 0.0;
      *(undefined8 *)&(pListener->velocity).z = 0x100000000;
      if ((pListener->config).handedness == ma_handedness_left) {
        (pListener->direction).x = -0.0;
        (pListener->direction).y = -0.0;
        (pListener->direction).z = 1.0;
      }
      (pListener->config).pChannelMapOut = (ma_channel *)pHeap;
      channels = pConfig->channelsOut;
      uVar12 = (ulong)channels;
      if (pConfig->pChannelMapOut == (ma_channel *)0x0) {
        if (channels == 2) {
          *(undefined2 *)pHeap = 0xc0b;
          mVar13 = MA_SUCCESS;
        }
        else {
          mVar13 = MA_SUCCESS;
          ma_channel_map_init_standard
                    (ma_standard_channel_map_default,(ma_channel *)pHeap,uVar12,channels);
        }
      }
      else {
        mVar13 = MA_SUCCESS;
        if (uVar12 != 0 && pHeap != (void *)0x0) {
          memcpy(pHeap,pConfig->pChannelMapOut,uVar12);
          mVar13 = MA_SUCCESS;
        }
      }
    }
  }
  return mVar13;
}

Assistant:

MA_API ma_result ma_spatializer_listener_init_preallocated(const ma_spatializer_listener_config* pConfig, void* pHeap, ma_spatializer_listener* pListener)
{
    ma_result result;
    ma_spatializer_listener_heap_layout heapLayout;

    if (pListener == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pListener);

    result = ma_spatializer_listener_get_heap_layout(pConfig, &heapLayout);
    if (result != MA_SUCCESS) {
        return result;
    }

    pListener->_pHeap = pHeap;
    MA_ZERO_MEMORY(pHeap, heapLayout.sizeInBytes);

    pListener->config    = *pConfig;
    pListener->position  = ma_vec3f_init_3f(0, 0,  0);
    pListener->direction = ma_vec3f_init_3f(0, 0, -1);
    pListener->velocity  = ma_vec3f_init_3f(0, 0,  0);
    pListener->isEnabled = MA_TRUE;

    /* Swap the forward direction if we're left handed (it was initialized based on right handed). */
    if (pListener->config.handedness == ma_handedness_left) {
        pListener->direction = ma_vec3f_neg(pListener->direction);
    }


    /* We must always have a valid channel map. */
    pListener->config.pChannelMapOut = (ma_channel*)ma_offset_ptr(pHeap, heapLayout.channelMapOutOffset);

    /* Use a slightly different default channel map for stereo. */
    if (pConfig->pChannelMapOut == NULL) {
        ma_get_default_channel_map_for_spatializer(pListener->config.pChannelMapOut, pConfig->channelsOut, pConfig->channelsOut);
    } else {
        ma_channel_map_copy_or_default(pListener->config.pChannelMapOut, pConfig->channelsOut, pConfig->pChannelMapOut, pConfig->channelsOut);
    }

    return MA_SUCCESS;
}